

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

bool __thiscall
ON_V4V5_MeshNgonUserData::Read(ON_V4V5_MeshNgonUserData *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  ON_V4V5_MeshNgonList *pOVar3;
  ON_V4V5_MeshNgon *pOVar4;
  int i;
  int iVar5;
  int N;
  int count;
  int minor_version;
  int major_version;
  
  pOVar3 = this->m_ngon_list;
  if (pOVar3 != (ON_V4V5_MeshNgonList *)0x0) {
    ON_V4V5_MeshNgonList::~ON_V4V5_MeshNgonList(pOVar3);
    operator_delete(pOVar3,0x18);
    this->m_ngon_list = (ON_V4V5_MeshNgonList *)0x0;
  }
  major_version = 0;
  minor_version = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&major_version,&minor_version);
  if (!bVar1) {
    return false;
  }
  if (major_version == 1) {
    count = 0;
    bVar1 = ON_BinaryArchive::ReadInt(archive,&count);
    if ((!bVar1) || (count < 1)) goto LAB_0053a247;
    pOVar3 = (ON_V4V5_MeshNgonList *)operator_new(0x18);
    ON_V4V5_MeshNgonList::ON_V4V5_MeshNgonList(pOVar3);
    this->m_ngon_list = pOVar3;
    ON_V4V5_MeshNgonList::V4V5_ReserveNgonCapacity(pOVar3,count);
    for (iVar5 = 0; iVar5 < count; iVar5 = iVar5 + 1) {
      N = 0;
      bVar1 = ON_BinaryArchive::ReadInt(archive,&N);
      if (!bVar1) {
LAB_0053a208:
        bVar1 = false;
        break;
      }
      if (0 < N) {
        pOVar4 = ON_V4V5_MeshNgonList::V4V5_AddNgon(this->m_ngon_list,N);
        if (pOVar4 == (ON_V4V5_MeshNgon *)0x0) {
          bVar1 = true;
          break;
        }
        bVar1 = ON_BinaryArchive::ReadInt(archive,(long)N,pOVar4->vi);
        if ((!bVar1) || (bVar1 = ON_BinaryArchive::ReadInt(archive,(long)N,pOVar4->fi), !bVar1))
        goto LAB_0053a208;
        pOVar4->N = N;
      }
      bVar1 = true;
    }
    if ((bVar1 == false) || (minor_version < 1)) goto LAB_0053a247;
    bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_mesh_F_count);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_mesh_V_count);
      goto LAB_0053a247;
    }
  }
  bVar1 = false;
LAB_0053a247:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_V4V5_MeshNgonUserData::Read(ON_BinaryArchive& archive)
{
  if ( 0 != m_ngon_list )
  {
    delete m_ngon_list;
    m_ngon_list = 0;
  }
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;
  for (;;)
  {
    rc = (1 == major_version);
    if (!rc)
      break;
    int count = 0;
    rc = archive.ReadInt(&count);
    if (count <= 0 || !rc)
      break;

    m_ngon_list = new ON_V4V5_MeshNgonList();
    if ( 0 == m_ngon_list )
      break;

    m_ngon_list->V4V5_ReserveNgonCapacity(count);

    for ( int i = 0; i < count; i++ )
    {
      int N = 0;
      rc = archive.ReadInt(&N);
      if (!rc)
        break;
      if ( N <= 0 )
        continue;
      class ON_V4V5_MeshNgon* ngon = m_ngon_list->V4V5_AddNgon(N);
      if ( 0 == ngon )
        break;

      rc = archive.ReadInt(N,ngon->vi);
      if (!rc)
        break;
      rc = archive.ReadInt(N,ngon->fi);
      if (!rc)
        break;
      ngon->N = N;
    }
    if (!rc)
      break;

    if ( minor_version >= 1 )
    {
      // chunk version 1.1 added face and vertex validation counts.
      rc = archive.ReadInt(&m_mesh_F_count);
      if (!rc)
        break;
      rc = archive.ReadInt(&m_mesh_V_count);
      if (!rc)
        break;
    }

    break;
  }
  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}